

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall chrono::robosimian::ContactManager::Process(ContactManager *this,RoboSimian *robot)

{
  allocator<std::_Sp_counted_deleter<chrono::robosimian::ContactManager_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_cecilysunday[P]chrono_src_chrono_models_robot_robosimian_RoboSimian_cpp:298:55),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
  *paVar1;
  ostream *poVar2;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<chrono::robosimian::ContactManager_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_cecilysunday[P]chrono_src_chrono_models_robot_robosimian_RoboSimian_cpp:298:55),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  _Stack_50;
  __shared_ptr<chrono::ChContactContainer::ReportContactCallback,(__gnu_cxx::_Lock_policy)2>
  local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<chrono::robosimian::ContactManager,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Report contacts");
  std::endl<char,std::char_traits<char>>(poVar2);
  this->m_num_contacts = 0;
  local_30._M_ptr = this;
  local_30._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  _Stack_50._M_alloc = &__a2;
  _Stack_50._M_ptr = (pointer)0x0;
  (local_30._M_refcount._M_pi)->_M_use_count = 1;
  (local_30._M_refcount._M_pi)->_M_weak_count = 1;
  (local_30._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_base_0019f948;
  local_30._M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)this;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<chrono::robosimian::ContactManager_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_models/robot/robosimian/RoboSimian.cpp:298:55),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&_Stack_50);
  std::__shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_50,
             (__shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2> *)
             (robot->m_system + 0x158));
  paVar1 = _Stack_50._M_alloc;
  std::__shared_ptr<chrono::ChContactContainer::ReportContactCallback,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::robosimian::ContactManager,void>(local_40,&local_30);
  (**(code **)(*(long *)paVar1 + 0x220))(paVar1,local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_50._M_ptr);
  poVar2 = std::operator<<((ostream *)&std::cout,"  total actual contacts: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_num_contacts);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void ContactManager::Process(RoboSimian* robot) {
    std::cout << "Report contacts" << std::endl;
    m_num_contacts = 0;
    std::shared_ptr<ContactManager> shared_this(this, [](ContactManager*) {});
    robot->GetSystem()->GetContactContainer()->ReportAllContacts(shared_this);
    std::cout << "  total actual contacts: " << m_num_contacts << std::endl << std::endl;
}